

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
IndexManager::FindSuchKey
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          IndexManager *this,STMT *S,TableInfo *T)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  _Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *this_00;
  _Base_ptr p_Var6;
  vector<condition,_std::allocator<condition>_> *pvVar7;
  long *plVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  undefined8 uVar14;
  _Base_ptr p_Var15;
  long *plVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  _Self __tmp;
  _Base_ptr p_Var20;
  BpTree<int> *this_01;
  BpTree<float> *this_02;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_03;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp1;
  string filename;
  condition C;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> temp2;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_318;
  _Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *local_2e8;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_2e0;
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0;
  undefined7 uStack_29f;
  int local_28c;
  undefined1 local_288 [8];
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  bool local_260;
  int iStack_25c;
  uint local_258;
  int local_250;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  int local_228;
  float fStack_224;
  IndexManager *local_220;
  TableInfo *local_218;
  STMT *local_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  key_type local_108;
  key_type local_e8;
  key_type local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
  *local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Base_ptr local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_60;
  
  local_2b0 = &local_2a0;
  local_2a8 = 0;
  local_2a0 = 0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_2e0._M_impl.super__Rb_tree_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar7 = S->c_list;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_220 = this;
  local_218 = T;
  local_210 = S;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_88 = &(T->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = &S->tableName;
    local_98 = &this->BpTrees_F;
    local_a0 = &this->BpTrees_I;
    local_a8 = &this->BpTrees_S;
    uVar19 = 0;
    local_28c = 0;
    local_2e8 = (_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
                __return_storage_ptr__;
    do {
      pcVar3 = (pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = ((long)(pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar3 >> 3) * 0x4ec4ec4ec4ec4ec5;
      if (uVar17 < uVar19 || uVar17 - uVar19 == 0) {
        uVar14 = std::__throw_out_of_range_fmt
                           ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            ,uVar19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_2e8;
        condition::~condition((condition *)local_288);
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        ~_Rb_tree(&local_60);
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        ~_Rb_tree(&local_2e0);
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        ~_Rb_tree((_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                   *)this_00);
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
        }
        _Unwind_Resume(uVar14);
      }
      local_288._0_4_ = pcVar3[uVar19].colunmID;
      local_280._M_p = (pointer)&local_270;
      _Var18._M_p = pcVar3[uVar19].colunmName._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,_Var18._M_p,
                 _Var18._M_p + pcVar3[uVar19].colunmName._M_string_length);
      local_258 = pcVar3[uVar19].op;
      pcVar5 = pcVar3 + uVar19;
      local_260 = pcVar5->isIndex;
      unique0x00012001 = *(undefined3 *)&pcVar5->field_0x29;
      iStack_25c = pcVar5->type;
      local_250 = pcVar3[uVar19].key.type;
      local_248._M_p = (pointer)&local_238;
      pcVar4 = pcVar3[uVar19].key.charV._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar4,pcVar4 + pcVar3[uVar19].key.charV._M_string_length);
      local_228 = pcVar3[uVar19].key.intV;
      fStack_224 = pcVar3[uVar19].key.floatV;
      __return_storage_ptr__ = (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_2e8;
      if (local_260 != false) {
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&local_60);
        __return_storage_ptr__ = (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_2e8;
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        operator=(&local_60,
                  (_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                   *)local_2e8);
        p_Var6 = local_88;
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&__return_storage_ptr__->_M_t);
        std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
        clear(&local_2e0);
        p_Var15 = p_Var6;
        for (p_Var20 = (local_218->indexInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ; p_Var20 != (_Base_ptr)0x0;
            p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < (int)local_288._0_4_]) {
          if ((int)local_288._0_4_ <= (int)p_Var20[1]._M_color) {
            p_Var15 = p_Var20;
          }
        }
        p_Var20 = p_Var6;
        if ((p_Var15 != p_Var6) &&
           (p_Var20 = p_Var15, (int)local_288._0_4_ < (int)p_Var15[1]._M_color)) {
          p_Var20 = p_Var6;
        }
        std::operator+(&local_80,&local_220->Direction,local_90);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_208 = &local_1f8;
        plVar16 = plVar8 + 2;
        if ((long *)*plVar8 == plVar16) {
          local_1f8 = *plVar16;
          lStack_1f0 = plVar8[3];
        }
        else {
          local_1f8 = *plVar16;
          local_208 = (long *)*plVar8;
        }
        local_200 = plVar8[1];
        *plVar8 = (long)plVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_208,(ulong)p_Var20[1]._M_parent);
        local_1e8 = &local_1d8;
        plVar16 = plVar8 + 2;
        if ((long *)*plVar8 == plVar16) {
          local_1d8 = *plVar16;
          lStack_1d0 = plVar8[3];
        }
        else {
          local_1d8 = *plVar16;
          local_1e8 = (long *)*plVar8;
        }
        local_1e0 = plVar8[1];
        *plVar8 = (long)plVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        pp_Var2 = &local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar16 = plVar8 + 2;
        if ((_Base_ptr *)*plVar8 == (_Base_ptr *)plVar16) {
          local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar16;
          local_318._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar8[3];
          local_318._M_impl._0_8_ = pp_Var2;
        }
        else {
          local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar16;
          local_318._M_impl._0_8_ = (_Base_ptr *)*plVar8;
        }
        local_318._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar8[1];
        *plVar8 = (long)plVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_318);
        if ((_Base_ptr *)local_318._M_impl._0_8_ != pp_Var2) {
          operator_delete((void *)local_318._M_impl._0_8_,
                          (ulong)((long)&(local_318._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8 + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (iStack_25c == 90000) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_2b0,local_2b0 + local_2a8);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>_>_>
                   ::find(&local_98->_M_t,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_02 = (BpTree<float> *)(iVar10._M_node + 2);
            switch(local_258) {
            case 0:
              BpTree<float>::FindEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224);
              break;
            case 1:
              BpTree<float>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224,true);
              break;
            case 2:
              BpTree<float>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224,false);
              break;
            case 3:
              BpTree<float>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224,true);
              break;
            case 4:
              BpTree<float>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224,false);
              break;
            case 5:
              BpTree<float>::FindNEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_02,
                         fStack_224);
            }
LAB_00125996:
            std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
            ::clear(&local_2e0);
            if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_color;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &p_Var1->_M_header;
              local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                   local_318._M_impl.super__Rb_tree_header._M_node_count;
              local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_318._M_impl.super__Rb_tree_header._M_header;
              local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_318._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
            ::~_Rb_tree(&local_318);
          }
        }
        else if (iStack_25c == 50000) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,local_2b0,local_2b0 + local_2a8);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>_>_>
                  ::find(&local_a0->_M_t,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_01 = (BpTree<int> *)(iVar9._M_node + 2);
            switch(local_258) {
            case 0:
              BpTree<int>::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,
                                  this_01,local_228);
              break;
            case 1:
              BpTree<int>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228,true);
              break;
            case 2:
              BpTree<int>::FindGreater
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228,false);
              break;
            case 3:
              BpTree<int>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228,true);
              break;
            case 4:
              BpTree<int>::FindLess
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228,false);
              break;
            case 5:
              BpTree<int>::FindNEQ
                        ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_01,
                         local_228);
            }
            goto LAB_00125996;
          }
        }
        else if (120000 < iStack_25c) {
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_2b0,local_2b0 + local_2a8);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::find(&local_a8->_M_t,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_258 < 6) {
            this_03 = (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(iVar11._M_node + 2);
            switch(local_258) {
            case 0:
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                       &local_128);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_128.field_2._M_allocated_capacity;
              _Var18._M_p = local_128._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_00125eb0:
                operator_delete(_Var18._M_p,uVar14 + 1);
              }
              break;
            case 1:
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_148,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                            &local_148,true);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_148.field_2._M_allocated_capacity;
              _Var18._M_p = local_148._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_00125eb0;
              break;
            case 2:
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_168,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindGreater((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                            &local_168,false);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_168.field_2._M_allocated_capacity;
              _Var18._M_p = local_168._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_00125eb0;
              break;
            case 3:
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                         &local_188,true);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_188.field_2._M_allocated_capacity;
              _Var18._M_p = local_188._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_00125eb0;
              break;
            case 4:
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1a8,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                         &local_1a8,false);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_1a8.field_2._M_allocated_capacity;
              _Var18._M_p = local_1a8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_00125eb0;
              break;
            case 5:
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,local_248._M_p,local_248._M_p + local_240);
              BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::FindNEQ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_318,this_03,
                        &local_1c8);
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              clear(&local_2e0);
              if (local_318._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_color;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
                local_2e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_318._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var1->_M_header;
                local_2e0._M_impl.super__Rb_tree_header._M_node_count =
                     local_318._M_impl.super__Rb_tree_header._M_node_count;
                local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_318._M_impl.super__Rb_tree_header._M_header;
                local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_318._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_318._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              std::
              _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
              ~_Rb_tree(&local_318);
              uVar14 = local_1c8.field_2._M_allocated_capacity;
              _Var18._M_p = local_1c8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00125eb0;
            }
          }
        }
        p_Var13 = local_2e0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_28c == 0) {
          std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::
          operator=(&__return_storage_ptr__->_M_t,&local_2e0);
        }
        else {
          for (; (_Rb_tree_header *)p_Var13 != p_Var1;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            iVar12 = std::
                     _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>
                     ::find(&local_60,(key_type *)(p_Var13 + 1));
            if ((_Rb_tree_header *)iVar12._M_node != &local_60._M_impl.super__Rb_tree_header) {
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,(Addr *)(p_Var13 + 1));
            }
          }
        }
        local_28c = local_28c + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_p != &local_270) {
        operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
      }
      pvVar7 = local_210->c_list;
      uVar19 = uVar19 + 1;
      uVar17 = ((long)(pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pvVar7->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar19 <= uVar17 && uVar17 - uVar19 != 0);
  }
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_60);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_2e0);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
  }
  return (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)
         (_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
         __return_storage_ptr__;
}

Assistant:

set<Addr> IndexManager::FindSuchKey(STMT S, TableInfo T) {
    string filename;
    int i, count = 0;
    set<Addr> ans, temp1, temp2;
    for (i = 0; i < S.c_list->size(); i++) {
        condition C = S.c_list->at(i);
        if (!C.isIndex)
            continue;						//如果不是index的约束条件，略过
        //将当前结果传给temp2作为中间变量
        temp2.clear();
        temp2 = ans;
        ans.clear();
        temp1.clear();
        int IndexColumn = C.colunmID;
        map<int, string>::iterator temp = T.indexInfo.find(IndexColumn);
        filename = Direction + S.tableName + "_" + temp->second + "_idx.dat";
        if (C.type == 50000) {
            BpTree<int>& Tree = FindBpTree_I(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.intV);			break;
                case 1: temp1 = Tree.FindGreater(C.key.intV, true); break;
                case 2: temp1 = Tree.FindGreater(C.key.intV, false);break;
                case 3: temp1 = Tree.FindLess(C.key.intV, true);	break;
                case 4: temp1 = Tree.FindLess(C.key.intV, false);	break;
                case 5: temp1 = Tree.FindNEQ(C.key.intV);			break;
                default:break;
            }
        }
        else if (C.type == 90000) {
            BpTree<float>& Tree = FindBpTree_F(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.floatV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.floatV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.floatV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.floatV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.floatV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.floatV);				break;
                default:break;
            }
        }
        else if (C.type > 120000) {
            BpTree<string>& Tree = FindBpTree_S(filename);
            switch (C.op) {
                case 0: temp1 = Tree.FindEQ(C.key.charV);				break;
                case 1: temp1 = Tree.FindGreater(C.key.charV, true);	break;
                case 2: temp1 = Tree.FindGreater(C.key.charV, false);	break;
                case 3: temp1 = Tree.FindLess(C.key.charV, true);		break;
                case 4: temp1 = Tree.FindLess(C.key.charV, false);		break;
                case 5: temp1 = Tree.FindNEQ(C.key.charV);				break;
                default:
                    break;
            }
        }
        if (count == 0) {
            ans = temp1;				//如果是第一个条件，那么得到的结果无需跟temp2取交集
        }
        else {
            set<Addr>::iterator it;		//如果不是第一个条件，得到的结果需要跟之前的结果temp2取交集
            it = temp1.begin();
            while (it != temp1.end()) {
                if (temp2.find(*it) != temp2.end())
                    ans.insert(*it);
                it++;
            }
        }
        count++;						//对索引条件计数
    }
    return ans;
}